

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

int __thiscall Imf_3_4::OutputFile::currentScanLine(OutputFile *this)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    iVar1 = this->_data->currentScanLine;
    pthread_mutex_unlock(__mutex);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int
OutputFile::currentScanLine () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    return _data->currentScanLine;
}